

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelPackage.cpp
# Opt level: O0

unique_ptr<JsonMap,_std::default_delete<JsonMap>_> __thiscall
MPL::detail::ModelPackageImpl::getItemInfoEntries(ModelPackageImpl *this)

{
  char *pcVar1;
  bool bVar2;
  pointer this_00;
  string *key;
  long in_RSI;
  allocator<char> local_71;
  string local_70 [55];
  allocator<char> local_39;
  string local_38;
  ModelPackageImpl *this_local;
  
  this_local = this;
  this_00 = std::unique_ptr<JsonMap,_std::default_delete<JsonMap>_>::operator->
                      ((unique_ptr<JsonMap,_std::default_delete<JsonMap>_> *)(in_RSI + 0x78));
  pcVar1 = kModelPackageItemInfoEntriesKey;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,pcVar1,&local_39);
  bVar2 = JsonMap::hasKey(this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  if (bVar2) {
    key = (string *)
          std::unique_ptr<JsonMap,_std::default_delete<JsonMap>_>::operator->
                    ((unique_ptr<JsonMap,_std::default_delete<JsonMap>_> *)(in_RSI + 0x78));
    pcVar1 = kModelPackageItemInfoEntriesKey;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_70,pcVar1,&local_71);
    JsonMap::getObject((JsonMap *)this,key);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator(&local_71);
  }
  else {
    std::make_unique<JsonMap>();
  }
  return (__uniq_ptr_data<JsonMap,_std::default_delete<JsonMap>,_true,_true>)
         (__uniq_ptr_data<JsonMap,_std::default_delete<JsonMap>,_true,_true>)this;
}

Assistant:

std::unique_ptr<JsonMap> ModelPackageImpl::getItemInfoEntries() const
{
    if (m_manifest->hasKey(kModelPackageItemInfoEntriesKey)) {
        return m_manifest->getObject(kModelPackageItemInfoEntriesKey);
    }

    return std::make_unique<JsonMap>();
}